

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

pdf_obj * pdf_new_string(hd_context *ctx,pdf_document *doc,char *str,size_t len)

{
  pdf_obj *ppVar1;
  
  if (len >> 0x20 == 0) {
    ppVar1 = (pdf_obj *)hd_malloc(ctx,len + 9);
    ppVar1->refs = 1;
    ppVar1->kind = 's';
    ppVar1->flags = '\0';
    ppVar1[1] = SUB84(len,0);
    memcpy(ppVar1 + 2,str,len);
    *(undefined1 *)((long)&ppVar1[2].refs + len) = 0;
    return ppVar1;
  }
  hd_throw(ctx,2,"Overflow in pdf string");
}

Assistant:

pdf_obj *
pdf_new_string(hd_context *ctx, pdf_document *doc, const char *str, size_t len)
{
    pdf_obj_string *obj;
    unsigned int l = (unsigned int)len;

    if ((size_t)l != len)
        hd_throw(ctx, HD_ERROR_GENERIC, "Overflow in pdf string");

    obj = Memento_label(hd_malloc(ctx, offsetof(pdf_obj_string, buf) + len + 1), "pdf_obj(string)");
    obj->super.refs = 1;
    obj->super.kind = PDF_STRING;
    obj->super.flags = 0;
    obj->len = l;
    memcpy(obj->buf, str, len);
    obj->buf[len] = '\0';
    return &obj->super;
}